

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O2

void thread2(void)

{
  ulong uVar1;
  char str [64];
  
  put_str((char *)0x1014cf);
  uVar1 = 0;
  do {
    if (the_thread->sched->shutdown_signal != false) {
      put_str((char *)0x10158d);
      return;
    }
    if (message == MsgFork) {
      fprintf((FILE *)out,"[Thread 2] forking worker: %d\n",uVar1);
      thread_start(the_thread->sched,worker);
LAB_0010154f:
      message = MsgNone;
    }
    else if (message == MsgPing) {
      fprintf((FILE *)out,"[Thread 2] received ping: %d\n",uVar1);
      goto LAB_0010154f;
    }
    snprintf(str,0x40,"[Thread 2] running: %d",uVar1);
    put_str((char *)0x101574);
    yield();
    uVar1 = (ulong)((int)uVar1 + 1);
  } while( true );
}

Assistant:

static void
thread2(void)
{
    put_str("[Thread 2] started");
    int tok = 0;
    while (!shutting_down()) {
        switch (message) {
        case MsgNone:
            break;
        case MsgPing:
            fprintf(out, "[Thread 2] received ping: %d\n", tok);
            message = MsgNone;
            break;
        case MsgFork:
            fprintf(out, "[Thread 2] forking worker: %d\n", tok);
            thread_start(the_thread->sched, worker);
            message = MsgNone;
            break;
        }
        char str[64];
        snprintf(str, sizeof str, "[Thread 2] running: %d", tok++);
        put_str(str);
        yield();
    }
    put_str("[Thread 2] exiting");
}